

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process-list.cpp
# Opt level: O0

void __thiscall dynamicgraph::CPU::System::readProcStat(System *this)

{
  bool bVar1;
  istream *piVar2;
  ulong uVar3;
  reference pvVar4;
  ulong local_5a0;
  unsigned_long i;
  istringstream local_590 [4];
  uint lcpunb;
  istringstream iss;
  string local_410 [8];
  string str_cpunbr;
  size_t pos;
  string line_hdr;
  istringstream anISSLine;
  string local_248 [8];
  string aline;
  istream local_218 [8];
  ifstream aif;
  System *this_local;
  
  std::ifstream::ifstream(local_218);
  this->cpuNb_ = 1;
  std::ifstream::open((char *)local_218,0x17e2b0);
  std::__cxx11::string::string(local_248);
  std::__cxx11::string::clear();
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,local_248);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::__cxx11::istringstream::istringstream
              ((istringstream *)(line_hdr.field_2._M_local_buf + 8),local_248,_S_in);
    std::__cxx11::string::string((string *)&pos);
    std::operator>>((istream *)(line_hdr.field_2._M_local_buf + 8),(string *)&pos);
    str_cpunbr.field_2._8_8_ = std::__cxx11::string::find((char *)&pos,0x17e2bb);
    std::__cxx11::string::substr((ulong)local_410,(ulong)&pos);
    if ((str_cpunbr.field_2._8_8_ == 0) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0)
       ) {
      CPUData::ProcessLine(&this->gCPUData_,(istringstream *)(line_hdr.field_2._M_local_buf + 8));
      (this->gCPUData_).cpu_id_ = -1;
    }
    else if (str_cpunbr.field_2._8_8_ == 0) {
      std::__cxx11::istringstream::istringstream(local_590,local_410,_S_in);
      std::istream::operator>>((istream *)local_590,(uint *)((long)&i + 4));
      if ((this->init_ & 1U) == 0) {
        if (this->cpuNb_ < i._4_4_) {
          this->cpuNb_ = i._4_4_;
        }
      }
      else {
        ProcessCPULine(this,i._4_4_,(istringstream *)(line_hdr.field_2._M_local_buf + 8));
      }
      std::__cxx11::istringstream::~istringstream(local_590);
    }
    std::__cxx11::string::~string(local_410);
    std::__cxx11::string::~string((string *)&pos);
    std::__cxx11::istringstream::~istringstream
              ((istringstream *)(line_hdr.field_2._M_local_buf + 8));
  }
  if ((this->init_ & 1U) == 0) {
    std::vector<dynamicgraph::CPU::CPUData,_std::allocator<dynamicgraph::CPU::CPUData>_>::resize
              (&this->vCPUData_,(ulong)(this->cpuNb_ + 1));
    for (local_5a0 = 0; local_5a0 < this->cpuNb_; local_5a0 = local_5a0 + 1) {
      pvVar4 = std::vector<dynamicgraph::CPU::CPUData,_std::allocator<dynamicgraph::CPU::CPUData>_>
               ::operator[](&this->vCPUData_,local_5a0);
      pvVar4->cpu_id_ = (int)local_5a0;
    }
  }
  std::ifstream::close();
  std::__cxx11::string::~string(local_248);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void System::readProcStat() {
  std::ifstream aif;
  cpuNb_ = 1;

  aif.open("/proc/stat", std::ifstream::in);
  std::string aline;
  aline.clear();
  while (std::getline(aif, aline)) {
    // Read on line of the file
    std::istringstream anISSLine(aline);
    std::string line_hdr;
    anISSLine >> line_hdr;

    // Check if the line start with cpu
    std::size_t pos = line_hdr.find("cpu");
    std::string str_cpunbr = line_hdr.substr(pos + 3);

    // Check if this is the  first line
    if (pos == 0 and str_cpunbr.empty()) {
      gCPUData_.ProcessLine(anISSLine);
      gCPUData_.cpu_id_ = -1;
    } else {
      // If not then check if there is a CPU number
      if (pos == 0) {
        std::istringstream iss(str_cpunbr);
        unsigned int lcpunb;
        iss >> lcpunb;
        // If we did not initialize
        if (!init_) {
          // Count the number of CPU.
          if (lcpunb > cpuNb_) cpuNb_ = lcpunb;
        } else
          // Otherwise process the line.
          ProcessCPULine(lcpunb, anISSLine);
      }
    }
  }

  if (!init_) {
    /// The number of CPU has been detected by going through /proc/stat.
    vCPUData_.resize(cpuNb_ + 1);
    for (unsigned long i = 0; i < (unsigned long)cpuNb_; i++)
      vCPUData_[i].cpu_id_ = (int)i;
  }
  aif.close();
}